

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurlquery.cpp
# Opt level: O0

bool __thiscall QUrlQuery::hasQueryItem(QUrlQuery *this,QString *key)

{
  long lVar1;
  bool bVar2;
  const_iterator o;
  long in_FS_OFFSET;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  undefined7 in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffef;
  const_iterator in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QSharedDataPointer<QUrlQueryPrivate>::operator!
                    ((QSharedDataPointer<QUrlQueryPrivate> *)0x314d1f);
  if (bVar2) {
    bVar2 = false;
  }
  else {
    QSharedDataPointer<QUrlQueryPrivate>::operator->
              ((QSharedDataPointer<QUrlQueryPrivate> *)0x314d36);
    QUrlQueryPrivate::findKey
              ((QUrlQueryPrivate *)in_stack_fffffffffffffff0.i,
               (QString *)CONCAT17(in_stack_ffffffffffffffef,in_stack_ffffffffffffffe8));
    QSharedDataPointer<QUrlQueryPrivate>::operator->
              ((QSharedDataPointer<QUrlQueryPrivate> *)0x314d52);
    o = QList<std::pair<QString,_QString>_>::constEnd
                  ((QList<std::pair<QString,_QString>_> *)
                   CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
    bVar2 = QList<std::pair<QString,_QString>_>::const_iterator::operator!=
                      ((const_iterator *)&stack0xfffffffffffffff0,o);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QUrlQuery::hasQueryItem(const QString &key) const
{
    if (!d)
        return false;
    return d->findKey(key) != d->itemList.constEnd();
}